

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Track.cpp
# Opt level: O0

int __thiscall Track::data_extent_bytes(Track *this,Sector *sector)

{
  sbyte sVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int local_40;
  int extent_bytes;
  int overhead_bytes;
  int gap_bytes;
  int encoding_shift;
  Sector *sector_local;
  Track *this_local;
  
  if ((sector->encoding == MFM) || (sector->encoding == FM)) {
    sVar1 = 4;
    if (sector->encoding == FM) {
      sVar1 = 5;
    }
    iVar2 = data_extent_bits(this,sector);
    iVar3 = GetSectorOverhead(sector->encoding);
    iVar4 = GetSyncOverhead(sector->encoding);
    if (iVar3 - iVar4 < iVar2 >> sVar1) {
      local_40 = (iVar2 >> sVar1) - (iVar3 - iVar4);
    }
    else {
      local_40 = 0;
    }
    this_local._4_4_ = local_40;
  }
  else {
    this_local._4_4_ = Sector::size(sector);
  }
  return this_local._4_4_;
}

Assistant:

int Track::data_extent_bytes(const Sector& sector) const
{
    // We only support real data extent for MFM and FM sectors.
    if (sector.encoding != Encoding::MFM && sector.encoding != Encoding::FM)
        return sector.size();

    auto encoding_shift = (sector.encoding == Encoding::FM) ? 5 : 4;
    auto gap_bytes = data_extent_bits(sector) >> encoding_shift;
    auto overhead_bytes = GetSectorOverhead(sector.encoding) - GetSyncOverhead(sector.encoding);
    auto extent_bytes = (gap_bytes > overhead_bytes) ? gap_bytes - overhead_bytes : 0;
    return extent_bytes;
}